

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

void __thiscall AGSMock::MockEngine::free(MockEngine *this,void *__ptr)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  int iVar3;
  char in_DL;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  _Node_iterator_base<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_false> __it;
  
  uVar1 = (this->data_->objects)._M_h._M_bucket_count;
  uVar4 = (ulong)__ptr % uVar1;
  p_Var5 = (this->data_->objects)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, p_Var5->_M_nxt[1]._M_nxt != (_Hash_node_base *)__ptr
     )) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, p_Var2[1]._M_nxt == (_Hash_node_base *)__ptr)) goto LAB_00107397;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_00107397:
  if (p_Var6 == (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)0x0;
  }
  else {
    __it._M_cur = (__node_type *)p_Var6->_M_nxt;
  }
  if ((__it._M_cur != (__node_type *)0x0) &&
     (((in_DL != '\0' ||
       (iVar3 = *(int *)((long)__it._M_cur + 0x10), *(int *)((long)__it._M_cur + 0x10) = iVar3 + -1,
       iVar3 < 2)) &&
      (iVar3 = (**(code **)**(undefined8 **)((long)__it._M_cur + 0x18))
                         (*(undefined8 **)((long)__it._M_cur + 0x18),__ptr,in_DL), iVar3 != 0)))) {
    std::
    _Hashtable<void_*,_std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>,_std::allocator<std::pair<void_*const,_AGSMock::MockEngine::Data::Resource>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->data_->objects)._M_h,(const_iterator)__it._M_cur);
    return;
  }
  return;
}

Assistant:

void MockEngine::free(void *object, bool force)
{
	decltype(data_->objects)::iterator it = data_->objects.find(object);

	if (it == data_->objects.end())
		return;

	if (!force && --it->second.count > 0)
		return;

	if (!it->second.callback->Dispose((const char *) object, force ? 1 : 0))
		return;

	data_->objects.erase(it);
}